

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O2

LogMessage * __thiscall
absl::log_internal::LogMessage::WithMetadataFrom(LogMessage *this,LogEntry *entry)

{
  LogMessageData *pLVar1;
  char *pcVar2;
  int iVar3;
  
  pLVar1 = (this->data_)._M_t.
           super___uniq_ptr_impl<absl::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::log_internal::LogMessage::LogMessageData>_>
           ._M_t.
           super__Tuple_impl<0UL,_absl::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::log_internal::LogMessage::LogMessageData>_>
           .super__Head_base<0UL,_absl::log_internal::LogMessage::LogMessageData_*,_false>.
           _M_head_impl;
  pcVar2 = (entry->full_filename_)._M_str;
  (pLVar1->entry).full_filename_._M_len = (entry->full_filename_)._M_len;
  *(char **)((long)&(pLVar1->entry).full_filename_ + 8) = pcVar2;
  pLVar1 = (this->data_)._M_t.
           super___uniq_ptr_impl<absl::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::log_internal::LogMessage::LogMessageData>_>
           ._M_t.
           super__Tuple_impl<0UL,_absl::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::log_internal::LogMessage::LogMessageData>_>
           .super__Head_base<0UL,_absl::log_internal::LogMessage::LogMessageData_*,_false>.
           _M_head_impl;
  pcVar2 = (entry->base_filename_)._M_str;
  (pLVar1->entry).base_filename_._M_len = (entry->base_filename_)._M_len;
  *(char **)((long)&(pLVar1->entry).base_filename_ + 8) = pcVar2;
  pLVar1 = (this->data_)._M_t.
           super___uniq_ptr_impl<absl::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::log_internal::LogMessage::LogMessageData>_>
           ._M_t.
           super__Tuple_impl<0UL,_absl::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::log_internal::LogMessage::LogMessageData>_>
           .super__Head_base<0UL,_absl::log_internal::LogMessage::LogMessageData_*,_false>.
           _M_head_impl;
  (pLVar1->entry).line_ = entry->line_;
  (pLVar1->entry).prefix_ = entry->prefix_;
  iVar3 = entry->verbose_level_;
  (pLVar1->entry).severity_ = entry->severity_;
  (pLVar1->entry).verbose_level_ = iVar3;
  *(HiRep *)&(pLVar1->entry).timestamp_ = (entry->timestamp_).rep_.rep_hi_;
  *(uint32_t *)((long)&(pLVar1->entry).timestamp_ + 8) = (entry->timestamp_).rep_.rep_lo_;
  (((this->data_)._M_t.
    super___uniq_ptr_impl<absl::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::log_internal::LogMessage::LogMessageData>_>
    ._M_t.
    super__Tuple_impl<0UL,_absl::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::log_internal::LogMessage::LogMessageData>_>
    .super__Head_base<0UL,_absl::log_internal::LogMessage::LogMessageData_*,_false>._M_head_impl)->
  entry).tid_ = entry->tid_;
  return this;
}

Assistant:

LogMessage& LogMessage::WithMetadataFrom(const absl::LogEntry& entry) {
  data_->entry.full_filename_ = entry.full_filename_;
  data_->entry.base_filename_ = entry.base_filename_;
  data_->entry.line_ = entry.line_;
  data_->entry.prefix_ = entry.prefix_;
  data_->entry.severity_ = entry.severity_;
  data_->entry.verbose_level_ = entry.verbose_level_;
  data_->entry.timestamp_ = entry.timestamp_;
  data_->entry.tid_ = entry.tid_;
  return *this;
}